

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  undefined4 uVar1;
  Node *this_00;
  uint64_t uVar2;
  Impl *pIVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  int iVar7;
  Node *b;
  WirePointer *pWVar8;
  iterator iVar9;
  size_t __n;
  ulong uVar10;
  bool bVar11;
  Reader RVar12;
  Reader params;
  PointerReader local_108;
  undefined1 local_d8 [56];
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_a0;
  
  __n = name.content.size_;
  resolveMember(&local_a0,this,name);
  if (local_a0.ptr.isSet == true) {
    if (local_a0.ptr.field_1.value.tag == 2) {
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = 2;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_a0.ptr.field_1._8_8_
      ;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           CONCAT44(local_a0.ptr.field_1._20_4_,local_a0.ptr.field_1._16_4_);
    }
    else if (local_a0.ptr.field_1.value.tag == 1) {
      if (local_a0.ptr.field_1._48_1_ == '\x01') {
        local_d8._39_8_ = local_a0.ptr.field_1._88_8_;
        local_d8._47_8_ = local_a0.ptr.field_1._96_8_;
        local_d8[0x17] = (undefined1)local_a0.ptr.field_1._72_8_;
        local_d8._24_4_ = (undefined4)((ulong)local_a0.ptr.field_1._72_8_ >> 8);
        local_d8._28_3_ = (undefined3)((ulong)local_a0.ptr.field_1._72_8_ >> 0x28);
        local_d8[0x1f] = (undefined1)local_a0.ptr.field_1._80_8_;
        local_d8._32_4_ = (undefined4)((ulong)local_a0.ptr.field_1._80_8_ >> 8);
        local_d8._36_2_ = (undefined2)((ulong)local_a0.ptr.field_1._80_8_ >> 0x28);
        local_d8[0x26] = (undefined1)((ulong)local_a0.ptr.field_1._80_8_ >> 0x38);
        local_d8[7] = (undefined1)local_a0.ptr.field_1._56_8_;
        local_d8._8_4_ = (undefined4)((ulong)local_a0.ptr.field_1._56_8_ >> 8);
        local_d8._12_3_ = (undefined3)((ulong)local_a0.ptr.field_1._56_8_ >> 0x28);
        local_d8[0xf] = (undefined1)local_a0.ptr.field_1._64_8_;
        local_d8._16_7_ = (undefined7)((ulong)local_a0.ptr.field_1._64_8_ >> 8);
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = 1;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_a0.ptr.field_1._8_8_
      ;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           CONCAT44(local_a0.ptr.field_1._20_4_,local_a0.ptr.field_1._16_4_);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           local_a0.ptr.field_1._24_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
           local_a0.ptr.field_1._32_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
           local_a0.ptr.field_1._40_8_;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) =
           local_a0.ptr.field_1._48_1_;
      if (local_a0.ptr.field_1._48_1_ != '\0') {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_d8._39_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_d8._47_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
             CONCAT35(local_d8._28_3_,CONCAT41(local_d8._24_4_,local_d8[0x17]));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
             CONCAT17(local_d8[0x26],
                      CONCAT25(local_d8._36_2_,CONCAT41(local_d8._32_4_,local_d8[0x1f])));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
             CONCAT35(local_d8._12_3_,CONCAT41(local_d8._8_4_,local_d8[7]));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
             CONCAT71(local_d8._16_7_,local_d8[0xf]);
      }
    }
    else {
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = local_a0.ptr.field_1.value.tag;
    }
  }
  else {
    bVar11 = 7 < (this->declaration)._reader.pointerCount;
    pWVar8 = (this->declaration)._reader.pointers + 7;
    if (!bVar11) {
      pWVar8 = (WirePointer *)0x0;
    }
    local_d8._24_4_ = (this->declaration)._reader.nestingLimit;
    if (bVar11) {
      local_d8._0_4_ = *(undefined4 *)&(this->declaration)._reader.segment;
      local_d8._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.segment + 4);
      local_d8._8_4_ = *(undefined4 *)&(this->declaration)._reader.capTable;
      local_d8._12_4_ = *(undefined4 *)((long)&(this->declaration)._reader.capTable + 4);
    }
    else {
      local_d8._0_4_ = 0;
      local_d8._4_4_ = 0;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      local_d8._24_4_ = 0x7fffffff;
    }
    local_d8._16_7_ = SUB87(pWVar8,0);
    local_d8[0x17] = (undefined1)((ulong)pWVar8 >> 0x38);
    capnp::_::PointerReader::getList
              ((ListReader *)&local_a0,(PointerReader *)local_d8,INLINE_COMPOSITE,(word *)0x0);
    if ((ulong)(uint)local_a0.ptr.field_1._16_4_ != 0) {
      uVar10 = 0;
      do {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)local_d8,(ListReader *)&local_a0,(ElementCount)uVar10);
        bVar11 = local_d8._36_2_ == 0;
        local_108.pointer._0_4_ = local_d8._24_4_;
        local_108.pointer._4_4_ = local_d8._28_4_;
        if (bVar11) {
          local_108.pointer._0_4_ = 0;
          local_108.pointer._4_4_ = 0;
        }
        local_108.nestingLimit = local_d8._40_4_;
        if (bVar11) {
          local_108.nestingLimit = 0x7fffffff;
        }
        local_108.segment._0_4_ = 0;
        local_108.segment._4_4_ = 0;
        local_108.capTable._0_4_ = 0;
        local_108.capTable._4_4_ = 0;
        if (!bVar11) {
          local_108.segment._0_4_ = local_d8._0_4_;
          local_108.segment._4_4_ = local_d8._4_4_;
          local_108.capTable._0_4_ = local_d8._8_4_;
          local_108.capTable._4_4_ = local_d8._12_4_;
        }
        RVar12 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_108,(void *)0x0,0);
        if ((RVar12.super_StringPtr.content.size_ == __n) &&
           ((__n == 0 ||
            (iVar7 = bcmp(RVar12.super_StringPtr.content.ptr,name.content.ptr,__n), iVar7 == 0)))) {
          uVar2 = this->id;
          (__return_storage_ptr__->ptr).isSet = true;
          (__return_storage_ptr__->ptr).field_1.value.tag = 2;
          *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar2;
          *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               (ElementCount)uVar10;
          return __return_storage_ptr__;
        }
        uVar10 = uVar10 + 1;
      } while ((uint)local_a0.ptr.field_1._16_4_ != uVar10);
    }
    this_00 = (this->parent).ptr;
    if (this_00 == (Node *)0x0) {
      pIVar3 = this->module->compiler;
      local_d8._0_4_ = name.content.ptr._0_4_;
      local_d8._4_4_ = name.content.ptr._4_4_;
      local_d8._8_4_ = (undefined4)name.content.size_;
      local_d8._12_4_ = name.content.size_._4_4_;
      iVar9 = std::
              _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
              ::find(&(pIVar3->builtinDecls)._M_t,(key_type *)local_d8);
      if (((_Rb_tree_header *)iVar9._M_node ==
           &(pIVar3->builtinDecls)._M_t._M_impl.super__Rb_tree_header) ||
         (p_Var4 = iVar9._M_node[1]._M_right, p_Var4 == (_Base_ptr)0x0)) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        p_Var5 = p_Var4[2]._M_parent;
        uVar1 = *(undefined4 *)&p_Var4[3].field_0x4;
        _Var6 = p_Var4[3]._M_color;
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 1;
        *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = p_Var5;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar1;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = 0;
        *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = (short)_Var6;
        *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = p_Var4;
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = 0;
      }
    }
    else {
      resolve(__return_storage_ptr__,this_00,name);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_SOME(member, resolveMember(name)) {
    return member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_SOME(p, parent) {
    return p.resolve(name);
  } else KJ_IF_SOME(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b.id, b.genericParamCount, 0, b.kind, &b, kj::none });
    return result;
  } else {
    return kj::none;
  }
}